

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceImage::commandsBeforeCompute
          (MemoryQualifierInstanceImage *this,VkCommandBuffer cmdBuffer,
          VkDeviceSize bufferSizeInBytes)

{
  VkImageSubresourceRange subresourceRange_00;
  deUint32 layerCount;
  DeviceInterface *pDVar1;
  Image *this_00;
  VkImage *pVVar2;
  undefined1 local_88 [8];
  VkImageMemoryBarrier imageLayoutBarrier;
  undefined4 uStack_38;
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *deviceInterface;
  VkDeviceSize bufferSizeInBytes_local;
  VkCommandBuffer cmdBuffer_local;
  MemoryQualifierInstanceImage *this_local;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  layerCount = getNumLayers((this->super_MemoryQualifierInstanceBase).m_imageType,
                            &(this->super_MemoryQualifierInstanceBase).m_imageSize);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&imageLayoutBarrier.field_0x44,1,0,1,0,layerCount);
  this_00 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator->(&(this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
  ;
  pVVar2 = image::Image::get(this_00);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.aspectMask = imageLayoutBarrier._68_4_;
  subresourceRange_00.baseMipLevel = uStack_38;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_88,0,0x20,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar2->m_internal,subresourceRange_00);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x4000,0x800,0,0,0,0,0,1,local_88);
  return;
}

Assistant:

void MemoryQualifierInstanceImage::commandsBeforeCompute (const VkCommandBuffer cmdBuffer, const VkDeviceSize bufferSizeInBytes) const
{
	DE_UNREF(bufferSizeInBytes);

	const DeviceInterface&			deviceInterface	 = m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier imageLayoutBarrier
		= makeImageMemoryBarrier(0u,
								 VK_ACCESS_SHADER_READ_BIT,
								 VK_IMAGE_LAYOUT_UNDEFINED,
								 VK_IMAGE_LAYOUT_GENERAL,
								 m_image->get(),
								 subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageLayoutBarrier);
}